

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O0

int qpdfjob_initialize_from_argv(qpdfjob_handle j,char **argv)

{
  int iVar1;
  anon_class_8_1_89897dde local_40;
  function<int_(_qpdfjob_handle_*)> local_38;
  char **local_18;
  char **argv_local;
  qpdfjob_handle j_local;
  
  local_40.argv = argv;
  local_18 = argv;
  argv_local = (char **)j;
  std::function<int(_qpdfjob_handle*)>::function<qpdfjob_initialize_from_argv::__0,void>
            ((function<int(_qpdfjob_handle*)> *)&local_38,&local_40);
  iVar1 = wrap_qpdfjob(j,&local_38);
  std::function<int_(_qpdfjob_handle_*)>::~function(&local_38);
  return iVar1;
}

Assistant:

int
qpdfjob_initialize_from_argv(qpdfjob_handle j, char const* const argv[])
{
    return wrap_qpdfjob(j, [argv](qpdfjob_handle jh) {
        jh->j.initializeFromArgv(argv);
        return 0;
    });
}